

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

optional<signed_char>
trial::dynamic::convert::
overloader<boost::optional<signed_char>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
::into(basic_variable<std::allocator<char>_> *data,error_code *error)

{
  bool bVar1;
  byte bVar2;
  ushort uVar3;
  error_category *peVar4;
  ushort uVar5;
  
  std::error_code::clear(error);
  bVar1 = basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>(data);
  if (!bVar1) {
    bVar1 = basic_variable<std::allocator<char>_>::is<signed_char>(data);
    if (bVar1) {
      bVar2 = detail::
              overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_signed_char,_void>::
              convert(data,error);
      uVar5 = (ushort)bVar2 << 8;
      uVar3 = 1;
      goto LAB_0010da6e;
    }
    peVar4 = error_category();
    error->_M_value = 1;
    error->_M_cat = peVar4;
  }
  uVar3 = 0;
  uVar5 = 0;
LAB_0010da6e:
  return (type)(uVar3 | uVar5);
}

Assistant:

static boost::optional<T> into(const basic_variable<Allocator>& data,
                                   std::error_code& error)
    {
        error.clear();

        if (data.template is<nullable>())
            return boost::none;

        if (data.template is<T>())
            return data.template value<T>(error);

        error = dynamic::make_error_code(incompatible_type);
        return {};
    }